

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_psrld_mmx_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  byte bVar1;
  int shift;
  MMXReg *s_local;
  MMXReg *d_local;
  CPUX86State *env_local;
  
  if (s->_q_MMXReg[0] < 0x20) {
    bVar1 = s->_b_MMXReg[0];
    d->_l_MMXReg[0] = d->_l_MMXReg[0] >> (bVar1 & 0x1f);
    d->_l_MMXReg[1] = d->_l_MMXReg[1] >> (bVar1 & 0x1f);
  }
  else {
    d->_q_MMXReg[0] = 0;
  }
  return;
}

Assistant:

void glue(helper_psrld, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int shift;

    if (s->Q(0) > 31) {
        d->Q(0) = 0;
#if SHIFT == 1
        d->Q(1) = 0;
#endif
    } else {
        shift = s->B(0);
        d->L(0) >>= shift;
        d->L(1) >>= shift;
#if SHIFT == 1
        d->L(2) >>= shift;
        d->L(3) >>= shift;
#endif
    }
}